

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhInstallCell(lhcell *pCell)

{
  lhpage *plVar1;
  lhcell *plVar2;
  lhcell *plVar3;
  uint uVar4;
  lhcell **pplVar5;
  lhcell **pplVar6;
  uint uVar7;
  uint uVar8;
  sxu32 sVar9;
  
  plVar1 = pCell->pPage->pMaster;
  if (plVar1->nCell == 0) {
    pplVar5 = (lhcell **)SyMemBackendAlloc(&plVar1->pHash->sAllocator,0x100);
    if (pplVar5 == (lhcell **)0x0) {
      return -1;
    }
    SyZero(pplVar5,0x100);
    plVar1->apCell = pplVar5;
    plVar1->nCellSize = 0x20;
    sVar9 = 0x20;
  }
  else {
    sVar9 = plVar1->nCellSize;
    pplVar5 = plVar1->apCell;
  }
  uVar4 = sVar9 - 1 & pCell->nHash;
  plVar2 = pplVar5[uVar4];
  pCell->pNextCol = plVar2;
  if (plVar2 != (lhcell *)0x0) {
    plVar2->pPrevCol = pCell;
  }
  pplVar5[uVar4] = pCell;
  pplVar5 = &plVar1->pList;
  if (plVar1->pFirst == (lhcell *)0x0) {
    pplVar6 = &plVar1->pFirst;
  }
  else {
    plVar2 = *pplVar5;
    pplVar6 = pplVar5;
    if (plVar2 == (lhcell *)0x0) goto LAB_00113544;
    pCell->pNext = plVar2;
    pplVar5 = &plVar2->pPrev;
  }
  *pplVar5 = pCell;
LAB_00113544:
  *pplVar6 = pCell;
  uVar4 = plVar1->nCell + 1;
  plVar1->nCell = uVar4;
  if (uVar4 < 100000 && sVar9 * 3 <= uVar4) {
    pplVar5 = (lhcell **)SyMemBackendAlloc(&plVar1->pHash->sAllocator,sVar9 << 4);
    if (pplVar5 != (lhcell **)0x0) {
      SyZero(pplVar5,sVar9 << 4);
      pplVar6 = &plVar1->pList;
      uVar4 = plVar1->nCell;
      for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
        plVar2 = *pplVar6;
        plVar2->pNextCol = (lhcell *)0x0;
        plVar2->pPrevCol = (lhcell *)0x0;
        uVar8 = plVar2->nHash & sVar9 * 2 - 1;
        plVar3 = pplVar5[uVar8];
        plVar2->pNextCol = plVar3;
        if (plVar3 != (lhcell *)0x0) {
          plVar3->pPrevCol = plVar2;
        }
        pplVar5[uVar8] = plVar2;
        pplVar6 = &plVar2->pNext;
      }
      SyMemBackendFree(&plVar1->pHash->sAllocator,plVar1->apCell);
      plVar1->apCell = pplVar5;
      plVar1->nCellSize = sVar9 * 2;
    }
  }
  return 0;
}

Assistant:

static int lhInstallCell(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;
	sxu32 iBucket;
	if( pPage->nCell < 1 ){
		sxu32 nTableSize = 32; /* Must be a power of two */
		lhcell **apTable;
		/* Allocate a new cell table */
		apTable = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nTableSize * sizeof(lhcell *));
		if( apTable == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Zero the new table */
		SyZero((void *)apTable, nTableSize * sizeof(lhcell *));
		/* Install it */
		pPage->apCell = apTable;
		pPage->nCellSize = nTableSize;
	}
	iBucket = pCell->nHash & (pPage->nCellSize - 1);
	pCell->pNextCol = pPage->apCell[iBucket];
	if( pPage->apCell[iBucket] ){
		pPage->apCell[iBucket]->pPrevCol = pCell;
	}
	pPage->apCell[iBucket] = pCell;
	if( pPage->pFirst == 0 ){
		pPage->pFirst = pPage->pList = pCell;
	}else{
		MACRO_LD_PUSH(pPage->pList,pCell);
	}
	pPage->nCell++;
	if( (pPage->nCell >= pPage->nCellSize * 3) && pPage->nCell < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pPage->nCellSize << 1;
		lhcell *pEntry;
		lhcell **apNew;
		sxu32 n;
		
		apNew = (lhcell **)SyMemBackendAlloc(&pPage->pHash->sAllocator, nNewSize * sizeof(lhcell *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(lhcell *));
			/* Rehash all entries */
			n = 0;
			pEntry = pPage->pList;
			for(;;){
				/* Loop one */
				if( n >= pPage->nCell ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->nHash & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pPage->pHash->sAllocator,(void *)pPage->apCell);
			pPage->apCell = apNew;
			pPage->nCellSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}